

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O3

int rw::PluginList::close(int __fd)

{
  long *plVar1;
  uint *puVar2;
  long lVar3;
  long *plVar4;
  int in_EAX;
  uint *puVar5;
  long *plVar6;
  
  plVar6 = allPlugins;
  if ((long **)allPlugins != &allPlugins) {
    do {
      plVar1 = (long *)*plVar6;
      puVar2 = (uint *)plVar6[-3];
      lVar3 = plVar6[-2];
      plVar4 = (long *)plVar6[-1];
      *plVar4 = lVar3;
      *(long **)(lVar3 + 8) = plVar4;
      lVar3 = *plVar6;
      plVar4 = (long *)plVar6[1];
      *plVar4 = lVar3;
      *(long **)(lVar3 + 8) = plVar4;
      (*DAT_0014ada0)(plVar6 + -0xd);
      puVar5 = puVar2 + 2;
      if (*(uint **)(puVar2 + 2) == puVar5) {
        puVar5 = (uint *)(ulong)puVar2[1];
        *puVar2 = puVar2[1];
      }
      in_EAX = (int)puVar5;
      plVar6 = plVar1;
    } while ((long **)plVar1 != &allPlugins);
  }
  return in_EAX;
}

Assistant:

void
PluginList::close(void)
{
	PluginList *l;
	Plugin *p;
	FORLIST(lnk, allPlugins){
		p = LLLinkGetData(lnk, Plugin, inGlobalList);
		l = p->parentList;
		p->inParentList.remove();
		p->inGlobalList.remove();
		rwFree(p);
		if(l->plugins.isEmpty())
			l->size = l->defaultSize;
	}
	assert(allPlugins.isEmpty());
}